

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
::insert(Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *pRVar2;
  undefined6 uVar3;
  RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *pRVar4;
  size_t sVar5;
  ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table;
  HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> local_28 [16];
  
  pEVar1 = (this->rows).builder.ptr;
  sVar5 = ((long)(this->rows).builder.pos - (long)pEVar1 >> 3) * -0x5555555555555555;
  table.size_ = (size_t)pEVar1;
  table.ptr = (Entry *)&this->indexes;
  HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
  insert<kj::HashMap<kj::StringPtr,unsigned_short>::Entry,kj::StringPtr&>
            (local_28,table,sVar5,(StringPtr *)sVar5);
  if (local_28[0] != (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x1) {
    pRVar4 = (this->rows).builder.pos;
    if (pRVar4 == (this->rows).builder.endPtr) {
      pRVar2 = (this->rows).builder.ptr;
      sVar5 = 4;
      if (pRVar4 != pRVar2) {
        sVar5 = ((long)pRVar4 - (long)pRVar2 >> 3) * 0x5555555555555556;
      }
      Vector<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry>::setCapacity(&this->rows,sVar5);
      pRVar4 = (this->rows).builder.pos;
    }
    uVar3 = *(undefined6 *)&row->field_0x12;
    pRVar4->value = row->value;
    *(undefined6 *)&pRVar4->field_0x12 = uVar3;
    sVar5 = (row->key).content.size_;
    (pRVar4->key).content.ptr = (row->key).content.ptr;
    (pRVar4->key).content.size_ = sVar5;
    pEVar1 = (this->rows).builder.pos;
    (this->rows).builder.pos = pEVar1 + 1;
    return pEVar1;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }